

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O1

int MD5_Final(uchar *md,MD5_CTX *c)

{
  uint *data;
  uchar uVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(c->A & 0x3f);
  data = c->data;
  lVar4 = uVar5 + 1;
  *(undefined1 *)((long)c->data + uVar5) = 0x80;
  uVar5 = uVar5 ^ 0x3f;
  if (uVar5 < 8) {
    memset((void *)(lVar4 + (long)data),0,uVar5);
    uVar5 = 0x40;
    body((MD5_CTX *)c,data,0x40);
    lVar4 = 0;
  }
  memset((void *)(lVar4 + (long)data),0,uVar5 - 8);
  uVar2 = c->A << 3;
  c->A = uVar2;
  uVar1 = curlx_ultouc((ulong)(uVar2 & 0xff));
  *(uchar *)(c->data + 0xe) = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->A + 1));
  *(uchar *)((long)c->data + 0x39) = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->A + 2));
  *(uchar *)((long)c->data + 0x3a) = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->A + 3));
  *(uchar *)((long)c->data + 0x3b) = uVar1;
  uVar1 = curlx_ultouc((ulong)(byte)c->B);
  *(uchar *)(c->data + 0xf) = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->B + 1));
  *(uchar *)((long)c->data + 0x3d) = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->B + 2));
  *(uchar *)((long)c->data + 0x3e) = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->B + 3));
  *(uchar *)((long)c->data + 0x3f) = uVar1;
  body((MD5_CTX *)c,data,0x40);
  uVar1 = curlx_ultouc((ulong)(byte)c->C);
  *md = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->C + 1));
  md[1] = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->C + 2));
  md[2] = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->C + 3));
  md[3] = uVar1;
  uVar1 = curlx_ultouc((ulong)(byte)c->D);
  md[4] = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->D + 1));
  md[5] = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->D + 2));
  md[6] = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->D + 3));
  md[7] = uVar1;
  uVar1 = curlx_ultouc((ulong)(byte)c->Nl);
  md[8] = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->Nl + 1));
  md[9] = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->Nl + 2));
  md[10] = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->Nl + 3));
  md[0xb] = uVar1;
  uVar1 = curlx_ultouc((ulong)(byte)c->Nh);
  md[0xc] = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->Nh + 1));
  md[0xd] = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->Nh + 2));
  md[0xe] = uVar1;
  uVar1 = curlx_ultouc((ulong)*(byte *)((long)&c->Nh + 3));
  md[0xf] = uVar1;
  pvVar3 = memset(c,0,0x98);
  return (int)pvVar3;
}

Assistant:

static void MD5_Final(unsigned char *result, MD5_CTX *ctx)
{
  unsigned long used, available;

  used = ctx->lo & 0x3f;

  ctx->buffer[used++] = 0x80;

  available = 64 - used;

  if(available < 8) {
    memset(&ctx->buffer[used], 0, available);
    body(ctx, ctx->buffer, 64);
    used = 0;
    available = 64;
  }

  memset(&ctx->buffer[used], 0, available - 8);

  ctx->lo <<= 3;
  ctx->buffer[56] = curlx_ultouc((ctx->lo)&0xff);
  ctx->buffer[57] = curlx_ultouc((ctx->lo >> 8)&0xff);
  ctx->buffer[58] = curlx_ultouc((ctx->lo >> 16)&0xff);
  ctx->buffer[59] = curlx_ultouc(ctx->lo >> 24);
  ctx->buffer[60] = curlx_ultouc((ctx->hi)&0xff);
  ctx->buffer[61] = curlx_ultouc((ctx->hi >> 8)&0xff);
  ctx->buffer[62] = curlx_ultouc((ctx->hi >> 16)&0xff);
  ctx->buffer[63] = curlx_ultouc(ctx->hi >> 24);

  body(ctx, ctx->buffer, 64);

  result[0] = curlx_ultouc((ctx->a)&0xff);
  result[1] = curlx_ultouc((ctx->a >> 8)&0xff);
  result[2] = curlx_ultouc((ctx->a >> 16)&0xff);
  result[3] = curlx_ultouc(ctx->a >> 24);
  result[4] = curlx_ultouc((ctx->b)&0xff);
  result[5] = curlx_ultouc((ctx->b >> 8)&0xff);
  result[6] = curlx_ultouc((ctx->b >> 16)&0xff);
  result[7] = curlx_ultouc(ctx->b >> 24);
  result[8] = curlx_ultouc((ctx->c)&0xff);
  result[9] = curlx_ultouc((ctx->c >> 8)&0xff);
  result[10] = curlx_ultouc((ctx->c >> 16)&0xff);
  result[11] = curlx_ultouc(ctx->c >> 24);
  result[12] = curlx_ultouc((ctx->d)&0xff);
  result[13] = curlx_ultouc((ctx->d >> 8)&0xff);
  result[14] = curlx_ultouc((ctx->d >> 16)&0xff);
  result[15] = curlx_ultouc(ctx->d >> 24);

  memset(ctx, 0, sizeof(*ctx));
}